

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

void __thiscall mjs::global_object_impl::popuplate_global(global_object_impl *this)

{
  gc_heap *num_bytes;
  bool bVar1;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>,_true> gVar2
  ;
  undefined4 uVar3;
  version vVar4;
  undefined8 *puVar5;
  object *this_00;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  gc_heap_ptr<mjs::function_object> throw_func;
  value eo;
  gc_heap_ptr<mjs::global_object> self;
  anon_class_8_1_89917c4a put_string_function;
  anon_class_8_1_8991fb9c add;
  wostringstream woss;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_230;
  undefined1 local_210 [72];
  uint32_t local_1c8;
  undefined1 local_1c0 [8];
  gc_heap_ptr_untyped local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->super_global_object).super_object.prototype_.pos_ == 0) {
    local_1a8._0_8_ = (gc_heap *)0x0;
    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
    gVar2.pos_ = 0;
  }
  else {
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_1a8,(uint32_t)(this->super_global_object).super_object.heap_);
    gVar2.pos_ = local_1a8._8_4_;
  }
  (this->object_prototype_).pos_ = gVar2.pos_;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
  num_bytes = (this->super_global_object).super_object.heap_;
  self_ptr((global_object_impl *)local_210);
  (*(this->super_global_object).super_object._vptr_object[0x13])(local_248,this,"Function");
  (*(this->super_global_object).super_object._vptr_object[0xb])(local_1c0 + 8,this);
  gc_heap::
  allocate_and_construct<mjs::function_object,mjs::gc_heap_ptr<mjs::global_object>,mjs::string,mjs::gc_heap_ptr<mjs::object>>
            ((gc_heap *)local_238,(size_t)num_bytes,(gc_heap_ptr<mjs::global_object> *)0x48,
             (string *)local_210,(gc_heap_ptr<mjs::object> *)local_248);
  local_1a8._0_8_ = local_238;
  local_1a8._8_4_ = local_230._0_4_;
  uVar3 = local_230._0_4_;
  if (local_238 != (undefined1  [8])0x0) {
    gc_heap::attach((gc_heap *)local_238,(gc_heap_ptr_untyped *)local_1a8);
    uVar3 = local_1a8._8_4_;
  }
  (this->function_prototype_).pos_ = uVar3;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_1c0 + 8));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_248);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_210);
  local_1c0 = (undefined1  [8])this;
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Object",make_object_object,&this->object_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Function",make_function_object,&this->function_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Array",make_array_object,&this->array_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"String",make_string_object,&this->string_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Boolean",make_boolean_object,&this->boolean_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Number",make_number_object,&this->number_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Math",anon_unknown_35::make_math_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"Date",make_date_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
             local_1c0,"console",anon_unknown_35::make_console_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  vVar4 = (this->super_global_object).version_;
  if (1 < (int)vVar4) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 local_1c0,"JSON",make_json_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
    vVar4 = (this->super_global_object).version_;
  }
  if (0 < (int)vVar4) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 local_1c0,"RegExp",make_regexp_object,&this->regexp_prototype_);
    uVar8 = 0;
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 local_1c0,"Error",make_error_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0
                );
    puVar7 = &native_error_types;
    do {
      if (uVar8 != *puVar7) {
        __assert_fail("native_error_types[i] == static_cast<native_error_type>(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x298,"void mjs::global_object_impl::popuplate_global()");
      }
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
      mjs::operator<<((wostream *)local_1a8,(native_error_type)uVar8);
      std::__cxx11::wstringbuf::str();
      local_248._0_8_ = local_210._8_8_;
      local_248._8_8_ = local_210._0_8_;
      (**(this->super_global_object).super_object._vptr_object)(local_238,this,local_248);
      if ((gc_heap *)local_210._0_8_ != (gc_heap *)(local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_,CONCAT44(local_210._20_4_,local_210._16_4_) * 4 + 4)
        ;
      }
      if (local_238._0_4_ != object) {
LAB_0013fe6e:
        __assert_fail("is_function(eo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29c,"void mjs::global_object_impl::popuplate_global()");
      }
      bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        ((gc_heap_ptr_untyped *)&local_230.s_);
      if (!bVar1) goto LAB_0013fe6e;
      if (local_238._0_4_ != object) goto LAB_0013fe8d;
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_230.s_);
      local_248._0_8_ = (gc_heap *)0x9;
      local_248._8_8_ = L"prototype";
      (**(code **)*puVar5)((value *)local_210,puVar5,local_248);
      if (local_210._0_4_ != object) {
        __assert_fail("prototype.type() == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29e,"void mjs::global_object_impl::popuplate_global()");
      }
      this->error_prototype_[uVar8].pos_ = local_210._16_4_;
      value::destroy((value *)local_210);
      value::destroy((value *)local_238);
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 1;
    } while (uVar8 != 8);
  }
  local_238 = (undefined1  [8])0x6;
  local_230.n_ = 8.27105416389914e-318;
  (**(this->super_global_object).super_object._vptr_object)(local_1a8,this);
  if (local_1a8._0_4_ == object) {
    this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_1a8 + 8));
    local_210._0_8_ = (gc_heap *)0x9;
    local_210._8_8_ = L"prototype";
    bVar1 = object::can_put(this_00,(wstring_view *)local_210);
    if (!bVar1) {
      value::destroy((value *)local_1a8);
      self_ptr((global_object_impl *)local_210);
      vVar4 = (this->super_global_object).version_;
      uVar6 = 2;
      if (0 < (int)vVar4) {
        uVar6 = 7 - (vVar4 < es5);
      }
      local_248._0_8_ = (gc_heap *)0x3;
      local_248._8_8_ = "NaN";
      string::string((string *)local_238,(this->super_global_object).super_object.heap_,
                     (string_view *)local_248);
      local_1a8._0_4_ = number;
      local_1a8._8_8_ = NAN;
      (*(this->super_global_object).super_object._vptr_object[1])
                (this,local_238,local_1a8,(ulong)uVar6);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
      local_248._0_8_ = (gc_heap *)0x8;
      local_248._8_8_ = "Infinity";
      string::string((string *)local_238,(this->super_global_object).super_object.heap_,
                     (string_view *)local_248);
      local_1a8._0_4_ = 3;
      local_1a8._8_8_ = INFINITY;
      (*(this->super_global_object).super_object._vptr_object[1])
                (this,local_238,local_1a8,(ulong)uVar6);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
      local_248._0_8_ = (gc_heap *)0x9;
      local_248._8_8_ = "undefined";
      string::string((string *)local_238,(this->super_global_object).super_object.heap_,
                     (string_view *)local_248);
      value::value((value *)local_1a8,(value *)&value::undefined);
      (*(this->super_global_object).super_object._vptr_object[1])
                (this,local_238,local_1a8,(ulong)uVar6);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
      local_1a8._0_8_ = local_210._0_8_;
      local_1a8._8_4_ = local_210._8_4_;
      if ((gc_heap *)local_210._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_238 = (undefined1  [8])(this->super_global_object).super_object.heap_;
      local_230._0_4_ = (this->super_global_object).version_;
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
                ((gc_heap_ptr<mjs::global_object> *)local_210,(object_ptr *)local_1a8,"parseInt",
                 (anon_class_16_2_fa5da7e4_for_f *)local_238,2);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_1a8._0_8_ = local_210._0_8_;
      local_1a8._8_4_ = local_210._8_4_;
      if ((gc_heap *)local_210._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
                ((gc_heap_ptr<mjs::global_object> *)local_210,(object_ptr *)local_1a8,"isNaN",
                 (anon_class_1_0_00000001_for_f *)local_238,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_1a8._0_8_ = local_210._0_8_;
      local_1a8._8_4_ = local_210._8_4_;
      if ((gc_heap *)local_210._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_3_>
                ((gc_heap_ptr<mjs::global_object> *)local_210,(object_ptr *)local_1a8,"isFinite",
                 (anon_class_1_0_00000001_for_f *)local_238,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_1a8._0_8_ = local_210._0_8_;
      local_1a8._8_4_ = local_210._8_4_;
      if ((gc_heap *)local_210._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_1a8);
      }
      local_238 = (undefined1  [8])(this->super_global_object).super_object.heap_;
      put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_4_>
                ((gc_heap_ptr<mjs::global_object> *)local_210,(object_ptr *)local_1a8,"alert",
                 (anon_class_8_1_54a39808_for_f *)local_238,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      local_210._40_8_ = (gc_heap_ptr<mjs::global_object> *)local_210;
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (local_210 + 0x28,"parseFloat",anon_unknown_35::parse_float);
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (local_210 + 0x28,"escape",anon_unknown_35::escape);
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (local_210 + 0x28,"unescape",anon_unknown_35::unescape);
      if (0 < (int)(this->super_global_object).version_) {
        popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                  (local_210 + 0x28,"encodeURI",anon_unknown_35::encode_uri);
        popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                  (local_210 + 0x28,"encodeURIComponent",anon_unknown_35::encode_uri_component);
        popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                  (local_210 + 0x28,"decodeURI",anon_unknown_35::decode_uri);
        popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                  (local_210 + 0x28,"decodeURIComponent",anon_unknown_35::decode_uri_component);
        if (1 < (int)(this->super_global_object).version_) {
          local_1a8._0_8_ = local_210._0_8_;
          local_1a8._8_4_ = local_210._8_4_;
          if ((gc_heap *)local_210._0_8_ != (gc_heap *)0x0) {
            gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_1a8);
          }
          (*(this->super_global_object).super_object._vptr_object[0x13])(local_238,this,"");
          make_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_5_>
                    ((mjs *)local_248,(gc_heap_ptr<mjs::global_object> *)local_210,
                     (anon_class_16_1_570cf4e1_for_f *)local_1a8,
                     (gc_heap_ptr<mjs::gc_string> *)local_238,0);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
          local_210._64_8_ = local_248._0_8_;
          local_1c8 = local_248._8_4_;
          if ((gc_heap *)local_248._0_8_ == (gc_heap *)0x0) {
            local_1a8._0_4_ = 5;
            local_1a8._8_8_ = (gc_heap *)0x0;
            local_1a8._16_4_ = local_248._8_4_;
          }
          else {
            gc_heap::attach((gc_heap *)local_248._0_8_,(gc_heap_ptr_untyped *)(local_210 + 0x40));
            local_1a8._0_4_ = 5;
            local_1a8._8_8_ = local_210._64_8_;
            local_1a8._16_4_ = local_1c8;
            if ((gc_heap *)local_210._64_8_ != (gc_heap *)0x0) {
              gc_heap::attach((gc_heap *)local_210._64_8_,(gc_heap_ptr_untyped *)(local_1a8 + 8));
            }
          }
          local_210._48_8_ = local_248._0_8_;
          local_210._56_4_ = local_248._8_4_;
          if ((gc_heap *)local_248._0_8_ == (gc_heap *)0x0) {
            local_238._0_4_ = 5;
            local_230.n_ = 0.0;
            local_230.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
                 local_248._8_4_;
          }
          else {
            gc_heap::attach((gc_heap *)local_248._0_8_,(gc_heap_ptr_untyped *)(local_210 + 0x30));
            local_238._0_4_ = 5;
            local_230.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                 (gc_heap *)local_210._48_8_;
            local_230.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
                 local_210._56_4_;
            if ((gc_heap *)local_210._48_8_ != (gc_heap *)0x0) {
              gc_heap::attach((gc_heap *)local_210._48_8_,(gc_heap_ptr_untyped *)&local_230.s_);
            }
          }
          make_accessor_object
                    ((mjs *)(local_1c0 + 8),(gc_heap_ptr<mjs::global_object> *)local_210,
                     (value *)local_1a8,(value *)local_238);
          (this->thrower_).pos_ = local_1b8.pos_;
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_1c0 + 8));
          value::destroy((value *)local_238);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_210 + 0x30));
          value::destroy((value *)local_1a8);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_210 + 0x40));
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_248);
        }
      }
      (*(this->super_global_object).super_object._vptr_object[0x13])(local_238,this,"global");
      local_248._0_8_ = local_210._0_8_;
      local_248._8_4_ = local_210._8_4_;
      if ((gc_heap *)local_210._0_8_ == (gc_heap *)0x0) {
        local_1a8._0_4_ = object;
        local_1a8._8_8_ = (gc_heap *)0x0;
        local_1a8._16_4_ = local_210._8_4_;
      }
      else {
        gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_248);
        local_1a8._0_4_ = object;
        local_1a8._8_8_ = local_248._0_8_;
        local_1a8._16_4_ = local_248._8_4_;
        if ((gc_heap *)local_248._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_248._0_8_,(gc_heap_ptr_untyped *)(local_1a8 + 8));
        }
      }
      (*(this->super_global_object).super_object._vptr_object[1])(this,local_238,local_1a8,5);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_248);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
      (*(this->super_global_object).super_object._vptr_object[0x13])(local_238,this,"this");
      local_248._0_8_ = local_210._0_8_;
      local_248._8_4_ = local_210._8_4_;
      if ((gc_heap *)local_210._0_8_ == (gc_heap *)0x0) {
        local_1a8._0_4_ = object;
        local_1a8._8_8_ = (gc_heap *)0x0;
        local_1a8._16_4_ = local_210._8_4_;
      }
      else {
        gc_heap::attach((gc_heap *)local_210._0_8_,(gc_heap_ptr_untyped *)local_248);
        local_1a8._0_4_ = object;
        local_1a8._8_8_ = local_248._0_8_;
        local_1a8._16_4_ = local_248._8_4_;
        if ((gc_heap *)local_248._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_248._0_8_,(gc_heap_ptr_untyped *)(local_1a8 + 8));
        }
      }
      (*(this->super_global_object).super_object._vptr_object[1])(this,local_238,local_1a8,7);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_248);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
      (*(this->super_global_object).super_object._vptr_object[0x13])(local_238,this,"length");
      local_1a8._0_4_ = 3;
      local_1a8._8_8_ = 0.0;
      (*(this->super_global_object).super_object._vptr_object[1])(this,local_238,local_1a8,7);
      value::destroy((value *)local_1a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_238);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_210);
      return;
    }
    __assert_fail("!get(L\"Object\").object_value()->can_put(L\"prototype\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                  ,0x2a3,"void mjs::global_object_impl::popuplate_global()");
  }
LAB_0013fe8d:
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

void popuplate_global() {
        // The object and function prototypes are special
        object_prototype_   = prototype(); // This way the global object will have the same functions as a normal object
        function_prototype_ = static_cast<object_ptr>(heap().make<function_object>(self_ptr(), common_string("Function"), object_prototype()));
         
        auto add = [&](const char* name, auto create_func, gc_heap_ptr_untracked<object>* prototype = nullptr) {
            auto res = create_func(self_ptr());
            put(common_string(name), value{res.obj}, default_attributes);
            if (res.prototype) {
                assert(res.obj.template has_type<function_object>());
                auto& f = static_cast<function_object&>(*res.obj);
                f.put_prototype_with_attributes(res.prototype, prototype_attributes);
            }
            if (prototype) {
                assert(res.prototype);
                *prototype = res.prototype;
            }
        };

        // §15.1
        add("Object", make_object_object, &object_prototype_);          // Resetting it..
        add("Function", make_function_object, &function_prototype_);    // same
        add("Array", make_array_object, &array_prototype_);
        add("String", make_string_object, &string_prototype_);
        add("Boolean", make_boolean_object, &boolean_prototype_);
        add("Number", make_number_object, &number_prototype_);
        add("Math", make_math_object);
        add("Date", make_date_object);
        add("console", make_console_object);
        if (version_ >= version::es5) {
            add("JSON", make_json_object);
        }

        if (language_version() >= version::es3) {
            add("RegExp", make_regexp_object, &regexp_prototype_);
            add("Error", make_error_object);

            // Grab error protototypes before the user can corrupt them
            for (uint32_t i = 0; i < num_native_error_types; ++i) {
                assert(native_error_types[i] == static_cast<native_error_type>(i));
                std::wostringstream woss;
                woss << static_cast<native_error_type>(i);
                auto eo = get(woss.str());
                assert(is_function(eo));
                auto prototype = eo.object_value()->get(L"prototype");
                assert(prototype.type() == value_type::object);
                error_prototype_[i] = prototype.object_value();
            }
        }

        assert(!get(L"Object").object_value()->can_put(L"prototype"));

        auto self = self_ptr();

        auto global_const_attrs = default_attributes;
        if (version_ >= version::es3) {
            global_const_attrs |= property_attribute::dont_delete;
        }
        if (version_ >= version::es5) {
            global_const_attrs |= property_attribute::read_only;
        }

        put(string{heap(), "NaN"}, value{NAN}, global_const_attrs);
        put(string{heap(), "Infinity"}, value{INFINITY}, global_const_attrs);
        put(string{heap(), "undefined"}, value{value::undefined}, global_const_attrs);

        // Note: eval is added by the interpreter

        put_native_function(self, self, "parseInt", [&h=heap(), ver=version_](const value&, const std::vector<value>& args) {
            const auto input = to_string(h, get_arg(args, 0));
            int radix = to_int32(get_arg(args, 1));
            return value{parse_int(input.view(), radix, ver)};
        }, 2);
        put_native_function(self, self, "isNaN", [](const value&, const std::vector<value>& args) {
            return value(std::isnan(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "isFinite", [](const value&, const std::vector<value>& args) {
            return value(std::isfinite(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "alert", [&h=heap()](const value&, const std::vector<value>& args) {
            std::wcout << "ALERT";
            for (auto& a: args) {
                std::wcout << "\t" << to_string(h, a);
            }
            std::wcout << "\n";
            return value::undefined;
        }, 1);

        auto put_string_function = [&](const char* name, auto f) {
            put_native_function(self, self, name, [self, f](const value&, const std::vector<value>& args) {
                const auto input = to_string(self.heap(), get_arg(args, 0));
                return f(self, input.view());
            }, 1);
        };

        put_string_function("parseFloat", &parse_float);
        put_string_function("escape", &escape);
        put_string_function("unescape", &unescape);

        if (version_ >= version::es3) {
            put_string_function("encodeURI", &encode_uri);
            put_string_function("encodeURIComponent", &encode_uri_component);
            put_string_function("decodeURI", &decode_uri);
            put_string_function("decodeURIComponent", &decode_uri_component);
        }

        if (version_ >= version::es5) {
            // ES5.1, 13.2.3 [[ThrowTypeError]]
            auto throw_func = make_function(self, [global = self](const value&, const std::vector<value>&) -> value {
                // For now only strict mode code uses this...
                throw native_error_exception{native_error_type::type, global->stack_trace(), "Property may not be accessed in strict mode"};
            }, common_string("").unsafe_raw_get(), 0);
            thrower_ = make_accessor_object(self, value{throw_func}, value{throw_func});

        }

        // Add this class as the global object
        put(common_string("global"), value{self}, property_attribute::dont_delete | property_attribute::read_only);

        put(common_string("this"), value{self}, prototype_attributes);

        // Make ES5 Conformance Suite happy
        put(common_string("length"), value{0.}, prototype_attributes);
    }